

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

int evmap_signal_check_integrity_fn(event_base *base,int signum,evmap_signal *sig_info,void *arg)

{
  event *extraout_RAX;
  event *peVar1;
  event *peVar2;
  event *peVar3;
  anon_union_32_2_36317463_for_ev_ *extraout_RDX;
  event *peVar4;
  
  peVar3 = (sig_info->events).lh_first;
  peVar2 = peVar3;
  peVar4 = peVar3;
  if (peVar3 != (event *)0x0) {
    do {
      peVar1 = peVar3;
      if ((peVar2 == (event *)0x0) ||
         (peVar4 = (peVar4->ev_).ev_io.ev_io_next.le_next, peVar4 == (event *)0x0))
      goto LAB_0024d734;
      if (peVar2 == peVar4) goto LAB_0024d78e;
      peVar4 = (peVar4->ev_).ev_io.ev_io_next.le_next;
      if (peVar4 == (event *)0x0) goto LAB_0024d734;
      peVar2 = (peVar2->ev_).ev_io.ev_io_next.le_next;
    } while (peVar2 != peVar4);
    evmap_signal_check_integrity_fn_cold_1();
    peVar3 = extraout_RAX;
    sig_info = (evmap_signal *)extraout_RDX;
    peVar1 = extraout_RAX;
LAB_0024d734:
    do {
      if (sig_info != (evmap_signal *)(peVar3->ev_).ev_io.ev_io_next.le_prev) {
        evmap_signal_check_integrity_fn_cold_2();
        goto LAB_0024d77a;
      }
      peVar4 = (peVar3->ev_).ev_io.ev_io_next.le_next;
      sig_info = (evmap_signal *)&peVar3->ev_;
      peVar3 = peVar4;
    } while (peVar4 != (event *)0x0);
    for (; peVar1 != (event *)0x0; peVar1 = (peVar1->ev_).ev_io.ev_io_next.le_next) {
      if (((peVar1->ev_evcallback).evcb_flags & 2) == 0) {
LAB_0024d77a:
        evmap_signal_check_integrity_fn_cold_6();
LAB_0024d77f:
        evmap_signal_check_integrity_fn_cold_3();
LAB_0024d784:
        evmap_signal_check_integrity_fn_cold_5();
LAB_0024d789:
        evmap_signal_check_integrity_fn_cold_4();
LAB_0024d78e:
        evmap_signal_check_integrity_fn_cold_7();
      }
      if (peVar1->ev_fd != signum) goto LAB_0024d77f;
      if ((peVar1->ev_events & 8U) == 0) goto LAB_0024d784;
      if ((peVar1->ev_events & 0x86U) != 0) goto LAB_0024d789;
    }
  }
  return 0;
}

Assistant:

static int
evmap_signal_check_integrity_fn(struct event_base *base,
    int signum, struct evmap_signal *sig_info, void *arg)
{
	struct event *ev;
	/* First, make sure the list itself isn't corrupt. */
	EVUTIL_ASSERT_LIST_OK(&sig_info->events, event, ev_signal_next);

	LIST_FOREACH(ev, &sig_info->events, ev_io_next) {
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_INSERTED);
		EVUTIL_ASSERT(ev->ev_fd == signum);
		EVUTIL_ASSERT((ev->ev_events & EV_SIGNAL));
		EVUTIL_ASSERT(!(ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED)));
	}
	return 0;
}